

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

int __thiscall
kj::anon_unknown_8::DiskFile::copy(DiskFile *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  DiskHandle *pDVar1;
  UnwindDetector __fd;
  Fault FVar2;
  Exception *pEVar3;
  int iVar4;
  __off_t _Var5;
  ssize_t sVar6;
  size_t __n;
  Exception *in_RCX;
  ulong uVar7;
  stat *__buf;
  stat *__buf_00;
  ulong uVar8;
  EVP_PKEY_CTX *pEVar9;
  ulong in_R8;
  Exception *pEVar10;
  DiskHandle *this_00;
  uint64_t size;
  size_t __nbytes;
  Exception *pEVar11;
  Fault f;
  Fault f_2;
  byte buffer [4096];
  Exception *local_1098;
  Fault local_1088;
  undefined8 uStack_1080;
  ulong local_1078;
  EVP_PKEY_CTX *local_1070;
  Fault local_1068;
  DiskHandle *local_1060;
  EVP_PKEY_CTX *local_1058;
  ulong local_1050;
  Exception *local_1048;
  ulong local_1040;
  AutoCloseFd local_1038;
  long lStack_1030;
  
  (*(code *)**(undefined8 **)src)(&local_1038,src);
  if ((char)local_1038.fd != '\x01') {
    iVar4 = File::copy(&this->super_File,dst,src);
    return iVar4;
  }
  this_00 = &this->super_DiskHandle;
  __fd.uncaughtCount = local_1038.unwindDetector.uncaughtCount;
  pEVar10 = (Exception *)(long)(int)local_1038.unwindDetector.uncaughtCount;
  pEVar11 = in_RCX;
  if (in_R8 == 0xffffffffffffffff && (in_RCX == (Exception *)0x0 && dst == (EVP_PKEY_CTX *)0x0)) {
    DiskHandle::stat((DiskHandle *)&local_1038,(char *)this_00,__buf);
    if (lStack_1030 == 0) {
      iVar4 = ioctl((this_00->fd).fd,0x40049409,(ulong)__fd.uncaughtCount);
      if (-1 < iVar4) {
        DiskHandle::stat((DiskHandle *)&local_1038,(char *)this_00,__buf_00);
        return (int)lStack_1030;
      }
      local_1098 = (Exception *)0x7fffffffffffffff;
      goto LAB_00216d3a;
    }
  }
  else if (in_R8 == 0) {
    return 0;
  }
  local_1078 = 0;
  if (in_R8 != 0xffffffffffffffff) {
    local_1078 = in_R8;
  }
  local_1088.exception = pEVar10;
  local_1070 = dst;
  iVar4 = ioctl((this_00->fd).fd,0x4020940d);
  if (-1 < iVar4) {
    (**(code **)(*(long *)src + 0x10))(&local_1038,src);
    uVar8 = lStack_1030 - (long)in_RCX;
    if (in_R8 <= (ulong)(lStack_1030 - (long)in_RCX)) {
      uVar8 = in_R8;
    }
    return (int)uVar8;
  }
  local_1098 = (Exception *)0x7fffffffffffffff;
  if (in_R8 != 0xffffffffffffffff) {
    local_1098 = (Exception *)((long)in_RCX->trace + (in_R8 - 0x50));
  }
LAB_00216d3a:
  pEVar10 = (Exception *)lseek(__fd.uncaughtCount,(__off_t)pEVar11,4);
  if ((long)pEVar10 < 0) {
    iVar4 = _::Debug::getOsErrorNumber(false);
    if (iVar4 == -1) goto LAB_00216d3a;
    if ((iVar4 != 0) && (pEVar10 = local_1098, iVar4 != 0x16)) {
      pEVar10 = pEVar11;
      if (iVar4 != 6) goto LAB_00217096;
      goto LAB_00217017;
    }
  }
  if ((long)local_1098 < (long)pEVar10) {
    pEVar10 = local_1098;
  }
  uVar8 = (long)pEVar10 - (long)pEVar11;
  if ((long)pEVar10 - (long)pEVar11 != 0) {
    do {
      local_1050 = uVar8;
      _Var5 = lseek((this_00->fd).fd,(__off_t)dst,0);
      pEVar9 = dst;
      FVar2.exception = pEVar11;
      pEVar3 = pEVar11;
      if (-1 < _Var5) goto joined_r0x00216dc8;
      iVar4 = _::Debug::getOsErrorNumber(false);
      uVar8 = local_1050;
    } while (iVar4 == -1);
    pEVar9 = dst;
    if (iVar4 != 0) {
      local_1088.exception = (Exception *)0x0;
      local_1038.fd = 0;
      local_1038.unwindDetector.uncaughtCount = 0;
      lStack_1030 = 0;
      _::Debug::Fault::init
                (&local_1088,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                );
      _::Debug::Fault::fatal(&local_1088);
    }
joined_r0x00216dc8:
    local_1048 = pEVar3;
    local_1088.exception = FVar2.exception;
    local_1058 = pEVar9;
    if ((long)local_1088.exception < (long)pEVar10) goto LAB_00216dca;
    goto LAB_00216e15;
  }
  goto LAB_00216e36;
LAB_00216dca:
  sVar6 = sendfile((this_00->fd).fd,__fd.uncaughtCount,(off_t *)&local_1088,
                   (long)pEVar10 - (long)local_1088.exception);
  if (sVar6 < 0) {
    iVar4 = _::Debug::getOsErrorNumber(false);
    if (iVar4 < 0) goto LAB_00216e0b;
    pEVar9 = local_1058;
    FVar2.exception = local_1088.exception;
    pEVar3 = local_1048;
    if (iVar4 == 0) goto joined_r0x00216dc8;
    if ((iVar4 != 0x16) && (iVar4 != 0x26)) goto LAB_00216fb5;
    uVar8 = 0;
    pDVar1 = this_00;
    uVar7 = local_1050;
    goto joined_r0x00216f1c;
  }
  pEVar9 = local_1058;
  FVar2.exception = local_1088.exception;
  pEVar3 = local_1048;
  if (sVar6 == 0) {
LAB_00216e15:
    uVar8 = (long)local_1088.exception - (long)pEVar11;
    goto LAB_00216e18;
  }
  goto joined_r0x00216dc8;
LAB_00216e0b:
  if (iVar4 != -1) {
LAB_00216fb5:
    local_1068.exception = (Exception *)0x0;
    local_1038.fd = 0;
    local_1038.unwindDetector.uncaughtCount = 0;
    lStack_1030 = 0;
    _::Debug::Fault::init
              (&local_1068,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    uVar8 = (long)local_1088.exception - (long)pEVar11;
    _::Debug::Fault::~Fault(&local_1068);
    goto LAB_00216e18;
  }
  goto LAB_00216dca;
joined_r0x00216f1c:
  if (uVar7 == 0) goto LAB_00216e18;
  __nbytes = 0x1000;
  local_1060 = pDVar1;
  local_1040 = uVar7;
  if (uVar7 < 0x1000) {
    __nbytes = uVar7;
  }
  do {
    __n = pread(__fd.uncaughtCount,&local_1038,__nbytes,(__off_t)pEVar11);
    if (-1 < (long)__n) {
      this_00 = local_1060;
      if (__n != 0) goto LAB_00216f82;
      goto LAB_00216e18;
    }
    iVar4 = _::Debug::getOsErrorNumber(false);
  } while (iVar4 == -1);
  if (iVar4 != 0) {
    local_1068.exception = (Exception *)0x0;
    local_1088.exception = (Exception *)0x0;
    uStack_1080 = 0;
    _::Debug::Fault::init
              (&local_1068,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    _::Debug::Fault::fatal(&local_1068);
  }
LAB_00216f82:
  this_00 = local_1060;
  DiskHandle::write(local_1060,(int)pEVar9,&local_1038,__n);
  pEVar11 = (Exception *)((long)pEVar11->trace + (__n - 0x50));
  pEVar9 = pEVar9 + __n;
  uVar8 = uVar8 + __n;
  uVar7 = local_1040 - __n;
  pDVar1 = local_1060;
  goto joined_r0x00216f1c;
LAB_00216e18:
  pEVar11 = (Exception *)((long)local_1048->trace + (uVar8 - 0x50));
  pEVar10 = pEVar11;
  if (uVar8 < local_1050) goto LAB_00217017;
  dst = local_1058 + uVar8;
LAB_00216e36:
  pEVar10 = local_1098;
  if (pEVar11 == local_1098) goto LAB_00217017;
  do {
    pEVar10 = (Exception *)lseek(__fd.uncaughtCount,(__off_t)pEVar11,3);
    if (-1 < (long)pEVar10) goto LAB_00216ebc;
    iVar4 = _::Debug::getOsErrorNumber(false);
  } while (iVar4 == -1);
  if (iVar4 != 0) {
    if (iVar4 != 6) {
      if (iVar4 == 0x16) {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
                  ((Fault *)&local_1038,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x262,FAILED,(char *)0x0,
                   "\"can\'t determine hole size; SEEK_DATA not supported\"",
                   (char (*) [51])"can\'t determine hole size; SEEK_DATA not supported");
        _::Debug::Fault::fatal((Fault *)&local_1038);
      }
LAB_00217096:
      lStack_1030 = 0;
      local_1038.fd = 0;
      local_1038.unwindDetector.uncaughtCount = 0;
      local_1088.exception = (Exception *)0x0;
      _::Debug::Fault::init
                (&local_1088,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                );
      _::Debug::Fault::~Fault(&local_1088);
      return (int)pEVar11 - (int)in_RCX;
    }
    do {
      pEVar10 = (Exception *)lseek(__fd.uncaughtCount,0,2);
      if (-1 < (long)pEVar10) goto LAB_00216e9d;
      iVar4 = _::Debug::getOsErrorNumber(false);
    } while (iVar4 == -1);
    if (iVar4 != 0) {
      local_1088.exception = (Exception *)0x0;
      local_1038.fd = 0;
      local_1038.unwindDetector.uncaughtCount = 0;
      lStack_1030 = 0;
      _::Debug::Fault::init
                (&local_1088,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                );
      _::Debug::Fault::fatal(&local_1088);
    }
LAB_00216e9d:
    if ((long)local_1098 < (long)pEVar10) {
      local_1098 = pEVar10;
    }
  }
LAB_00216ebc:
  if ((long)local_1098 < (long)pEVar10) {
    pEVar10 = local_1098;
  }
  size = (long)pEVar10 - (long)pEVar11;
  if (size != 0 && (long)pEVar11 <= (long)pEVar10) {
    DiskHandle::zero(this_00,(uint64_t)dst,size);
    dst = dst + size;
    pEVar11 = pEVar10;
  }
  pEVar10 = local_1098;
  if (pEVar11 == local_1098) {
LAB_00217017:
    return (int)pEVar10 - (int)in_RCX;
  }
  goto LAB_00216d3a;
}

Assistant:

size_t copy(uint64_t offset, const ReadableFile& from,
              uint64_t fromOffset, uint64_t size) const override {
    KJ_IF_MAYBE(result, DiskHandle::copy(offset, from, fromOffset, size)) {
      return *result;
    } else {
      return File::copy(offset, from, fromOffset, size);
    }